

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

iterator * __thiscall
google::protobuf::Map<long,_double>::InnerMap::InsertUniqueInTree
          (iterator *__return_storage_ptr__,InnerMap *this,size_type b,Node *node)

{
  LogMessage *other;
  pair<std::_Rb_tree_iterator<long_*>,_bool> pVar1;
  Node *local_70;
  LogMessage local_68;
  
  if (this->table_[b] != this->table_[b ^ 1]) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x2b8);
    other = internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (table_[b]) == (table_[b ^ 1]): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_70,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  node->next = (Node *)0x0;
  local_70 = node;
  pVar1 = std::
          _Rb_tree<long*,long*,std::_Identity<long*>,google::protobuf::Map<long,double>::InnerMap::KeyCompare,google::protobuf::Map<long,double>::MapAllocator<long*>>
          ::_M_insert_unique<long*>
                    ((_Rb_tree<long*,long*,std::_Identity<long*>,google::protobuf::Map<long,double>::InnerMap::KeyCompare,google::protobuf::Map<long,double>::MapAllocator<long*>>
                      *)this->table_[b],(long **)&local_70);
  iterator_base<google::protobuf::Map<long,_double>::KeyValuePair>::iterator_base
            (__return_storage_ptr__,(_Base_ptr)pVar1.first._M_node,this,b & 0xfffffffffffffffe);
  return __return_storage_ptr__;
}

Assistant:

iterator InsertUniqueInTree(size_type b, Node* node) {
      GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
      // Maintain the invariant that node->next is NULL for all Nodes in Trees.
      node->next = NULL;
      return iterator(static_cast<Tree*>(table_[b])
                      ->insert(KeyPtrFromNodePtr(node))
                      .first,
                      this, b & ~static_cast<size_t>(1));
    }